

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_Stare(void)

{
  Task *in_RDI;
  value_type local_770;
  undefined1 local_768 [8];
  Task bark;
  string local_3e8;
  undefined1 local_3c8 [8];
  Task focusPlayer;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  Task *stare;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"stare",&local_39);
  Task::Task(in_RDI,&local_38,Compound);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"focusPlayer",
             (allocator<char> *)
             ((long)&bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  Task::Task((Task *)local_3c8,&local_3e8,Simple);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  focusPlayer.modifiedVectors._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0xb;
  create_Bark((Task *)local_768,StaringAtPlayer);
  Task::addSubtask(in_RDI,(Task *)local_3c8);
  Task::addSubtask(in_RDI,(Task *)local_768);
  local_770.id = PlayerIdentified;
  local_770.flag = true;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::push_back
            (&(in_RDI->postconditions).requiredFlags,&local_770);
  local_11 = 1;
  Task::~Task((Task *)local_768);
  Task::~Task((Task *)local_3c8);
  if ((local_11 & 1) == 0) {
    Task::~Task(in_RDI);
  }
  return in_RDI;
}

Assistant:

Task create_Stare()
	{
		Task stare {"stare", TaskType::Compound};

		Task focusPlayer {"focusPlayer"};
		focusPlayer.action = Action::FocusPlayer;

		auto bark = create_Bark(Bark::StaringAtPlayer);

		//auto playMontage = create_PlayMontage(Montage::Stare);

		stare.addSubtask(focusPlayer);
		stare.addSubtask(bark);
		//stare.addSubtask(playMontage);

		stare.postconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});

		return stare;
	}